

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O1

void __thiscall
Js::JavascriptStringObject::JavascriptStringObject(JavascriptStringObject *this,DynamicType *type)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_20;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01547240;
  (this->value).ptr = (JavascriptString *)0x0;
  if ((type->super_Type).typeId != TypeIds_StringObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptStringObject.cpp"
                                ,0xc,"(type->GetTypeId() == TypeIds_StringObject)",
                                "type->GetTypeId() == TypeIds_StringObject");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pDVar5 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  DynamicTypeHandler::SetHasOnlyWritableDataProperties(pDVar5,false);
  pDVar5 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  if ((pDVar5->flags & 0x20) != 0) {
    pJVar1 = (((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
    Memory::Recycler::WBSetBit((char *)&local_20);
    local_20 = &pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_20);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_20);
  }
  return;
}

Assistant:

JavascriptStringObject::JavascriptStringObject(DynamicType * type)
        : DynamicObject(type), value(nullptr)
    {
        Assert(type->GetTypeId() == TypeIds_StringObject);

        this->GetTypeHandler()->ClearHasOnlyWritableDataProperties(); // length is non-writable
        if(GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {

            // No need to invalidate store field caches for non-writable properties here. Since this type is just being created, it cannot represent
            // an object that is already a prototype. If it becomes a prototype and then we attempt to add a property to an object derived from this
            // object, then we will check if this property is writable, and only if it is will we do the fast path for add property.
            GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }
    }